

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

void Gia_ManSpecBuildInit
               (Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vXorLits,int f,int fDualOut)

{
  Gia_Obj_t *pGVar1;
  Gia_Rpr_t GVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  Gia_Obj_t *pGVar10;
  uint uVar11;
  
  pGVar4 = p->pObjs;
  if (pGVar4 <= pObj) {
    iVar7 = p->nObjs;
    pGVar1 = pGVar4 + iVar7;
    if (pObj < pGVar1) {
      iVar8 = (int)((long)pObj - (long)pGVar4 >> 2) * -0x55555555;
      GVar2 = p->pReprs[iVar8];
      uVar9 = (ulong)(uint)GVar2 & 0xfffffff;
      if (uVar9 == 0xfffffff) {
        pGVar10 = (Gia_Obj_t *)0x0;
      }
      else {
        if (iVar7 <= (int)uVar9) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar10 = pGVar4 + uVar9;
      }
      if (pGVar10 == (Gia_Obj_t *)0x0) {
        return;
      }
      if (fDualOut != 0) {
        if ((pGVar10 < pGVar4) || (pGVar1 <= pGVar10)) goto LAB_002010fc;
        if (((uint)p->pReprs[(int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * -0x55555555] ^
            (uint)GVar2) < 0x40000000) {
          return;
        }
      }
      if ((pGVar4 <= pGVar10) && (pGVar10 < pGVar1)) {
        uVar11 = (int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * -0x55555555 + iVar7 * f;
        if (((int)uVar11 < 0) || (iVar3 = (p->vCopies).nSize, iVar3 <= (int)uVar11)) {
LAB_0020111b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar5 = (p->vCopies).pArray;
        uVar11 = piVar5[uVar11];
        if ((int)uVar11 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        if (pGVar4 <= pObj) {
          uVar6 = iVar7 * f + iVar8;
          if (((int)uVar6 < 0) || (iVar3 <= (int)uVar6)) goto LAB_0020111b;
          uVar11 = uVar11 ^ ((uint)((ulong)*(undefined8 *)((ulong)pGVar10 & 0xfffffffffffffffe) >>
                                   0x3f) ^ (uint)pGVar10 & 1) !=
                            ((uint)((ulong)*(undefined8 *)((ulong)pObj & 0xfffffffffffffffe) >> 0x3f
                                   ) ^ (uint)pObj & 1);
          if ((((uint)GVar2 >> 0x1c & 1) == 0) && (uVar6 = piVar5[uVar6], uVar6 != uVar11)) {
            iVar7 = Gia_ManHashXor(pNew,uVar6,uVar11);
            Vec_IntPush(vXorLits,iVar7);
          }
          pGVar4 = p->pObjs;
          if ((pGVar4 <= pObj) && (pObj < pGVar4 + p->nObjs)) {
            uVar6 = (int)((ulong)((long)pObj - (long)pGVar4) >> 2) * -0x55555555 + p->nObjs * f;
            if ((-1 < (int)uVar6) && ((int)uVar6 < (p->vCopies).nSize)) {
              (p->vCopies).pArray[uVar6] = uVar11;
              return;
            }
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
        }
      }
    }
  }
LAB_002010fc:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManSpecBuildInit( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vXorLits, int f, int fDualOut )
{
    Gia_Obj_t * pRepr;
    int iLitNew;
    pRepr = Gia_ObjReprObj( p, Gia_ObjId(p,pObj) );
    if ( pRepr == NULL )
        return;
//    if ( fDualOut && !Gia_ObjDiffColors( p, Gia_ObjId(p, pObj), Gia_ObjId(p, pRepr) ) )
    if ( fDualOut && !Gia_ObjDiffColors2( p, Gia_ObjId(p, pObj), Gia_ObjId(p, pRepr) ) )
        return;
    iLitNew = Abc_LitNotCond( Gia_ObjCopyF(p, f, pRepr), Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) );
    if ( Gia_ObjCopyF(p, f, pObj) != iLitNew && !Gia_ObjProved(p, Gia_ObjId(p,pObj)) )
        Vec_IntPush( vXorLits, Gia_ManHashXor(pNew, Gia_ObjCopyF(p, f, pObj), iLitNew) );
    Gia_ObjSetCopyF( p, f, pObj, iLitNew );
}